

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O0

BuildValue * __thiscall
llbuild::buildsystem::ExternalCommand::getResultForOutput
          (BuildValue *__return_storage_ptr__,ExternalCommand *this,Node *node,BuildValue *value)

{
  FileInfo outputInfo;
  bool bVar1;
  uint uVar2;
  difference_type dVar3;
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  FileInfo *local_68;
  FileInfo *info;
  difference_type local_58;
  difference_type idx;
  BuildNode **local_48;
  __normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
  local_40;
  __normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
  local_38;
  __normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
  it;
  BuildNode *buildNode;
  BuildValue *value_local;
  Node *node_local;
  ExternalCommand *this_local;
  
  value_local = (BuildValue *)node;
  node_local = (Node *)this;
  this_local = (ExternalCommand *)__return_storage_ptr__;
  bVar1 = BuildValue::isFailedCommand(value);
  if (((bVar1) || (bVar1 = BuildValue::isPropagatedFailureCommand(value), bVar1)) ||
     (bVar1 = BuildValue::isCancelledCommand(value), bVar1)) {
    BuildValue::makeFailedInput();
  }
  else {
    bVar1 = BuildValue::isSkippedCommand(value);
    if (bVar1) {
      BuildValue::makeSkippedCommand();
    }
    else {
      bVar1 = BuildValue::isSuccessfulCommand(value);
      if (!bVar1) {
        __assert_fail("value.isSuccessfulCommand()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                      ,0x8c,
                      "virtual BuildValue llbuild::buildsystem::ExternalCommand::getResultForOutput(Node *, const BuildValue &)"
                     );
      }
      it._M_current = (BuildNode **)value_local;
      bVar1 = BuildNode::isVirtual((BuildNode *)value_local);
      if ((!bVar1) || (bVar1 = BuildNode::isCommandTimestamp((BuildNode *)it._M_current), bVar1)) {
        local_40._M_current =
             (BuildNode **)
             std::
             vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
             ::begin(&(this->super_Command).outputs);
        local_48 = (BuildNode **)
                   std::
                   vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                   ::end(&(this->super_Command).outputs);
        local_38 = std::
                   find<__gnu_cxx::__normal_iterator<llbuild::buildsystem::BuildNode**,std::vector<llbuild::buildsystem::BuildNode*,std::allocator<llbuild::buildsystem::BuildNode*>>>,llbuild::buildsystem::Node*>
                             (local_40,(__normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
                                        )local_48,(Node **)&value_local);
        idx = (difference_type)
              std::
              vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
              ::end(&(this->super_Command).outputs);
        bVar1 = __gnu_cxx::operator!=
                          (&local_38,
                           (__normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
                            *)&idx);
        if (!bVar1) {
          __assert_fail("it != outputs.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                        ,0x9c,
                        "virtual BuildValue llbuild::buildsystem::ExternalCommand::getResultForOutput(Node *, const BuildValue &)"
                       );
        }
        info = (FileInfo *)
               std::
               vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
               ::begin(&(this->super_Command).outputs);
        dVar3 = __gnu_cxx::operator-
                          (&local_38,
                           (__normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
                            *)&info);
        local_58 = dVar3;
        uVar2 = BuildValue::getNumOutputs(value);
        if ((long)(ulong)uVar2 <= dVar3) {
          __assert_fail("idx < static_cast<ssize_t>(value.getNumOutputs())",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                        ,0x9f,
                        "virtual BuildValue llbuild::buildsystem::ExternalCommand::getResultForOutput(Node *, const BuildValue &)"
                       );
        }
        local_68 = BuildValue::getNthOutputInfo(value,(uint)local_58);
        bVar1 = llbuild::basic::FileInfo::isMissing(local_68);
        if (bVar1) {
          BuildValue::makeMissingOutput();
        }
        else {
          memcpy(local_b8,local_68,0x50);
          outputInfo.inode = local_a8;
          outputInfo.device = uStack_b0;
          outputInfo.mode = uStack_a0;
          outputInfo.size = local_98;
          outputInfo.modTime.seconds = uStack_90;
          outputInfo.modTime.nanoseconds = local_88;
          outputInfo.checksum.bytes[0] = (undefined1)uStack_80;
          outputInfo.checksum.bytes[1] = uStack_80._1_1_;
          outputInfo.checksum.bytes[2] = uStack_80._2_1_;
          outputInfo.checksum.bytes[3] = uStack_80._3_1_;
          outputInfo.checksum.bytes[4] = uStack_80._4_1_;
          outputInfo.checksum.bytes[5] = uStack_80._5_1_;
          outputInfo.checksum.bytes[6] = uStack_80._6_1_;
          outputInfo.checksum.bytes[7] = uStack_80._7_1_;
          outputInfo.checksum.bytes[8] = (undefined1)local_78;
          outputInfo.checksum.bytes[9] = local_78._1_1_;
          outputInfo.checksum.bytes[10] = local_78._2_1_;
          outputInfo.checksum.bytes[0xb] = local_78._3_1_;
          outputInfo.checksum.bytes[0xc] = local_78._4_1_;
          outputInfo.checksum.bytes[0xd] = local_78._5_1_;
          outputInfo.checksum.bytes[0xe] = local_78._6_1_;
          outputInfo.checksum.bytes[0xf] = local_78._7_1_;
          outputInfo.checksum.bytes[0x10] = (undefined1)uStack_70;
          outputInfo.checksum.bytes[0x11] = uStack_70._1_1_;
          outputInfo.checksum.bytes[0x12] = uStack_70._2_1_;
          outputInfo.checksum.bytes[0x13] = uStack_70._3_1_;
          outputInfo.checksum.bytes[0x14] = uStack_70._4_1_;
          outputInfo.checksum.bytes[0x15] = uStack_70._5_1_;
          outputInfo.checksum.bytes[0x16] = uStack_70._6_1_;
          outputInfo.checksum.bytes[0x17] = uStack_70._7_1_;
          outputInfo.checksum.bytes[0x18] = (char)dVar3;
          outputInfo.checksum.bytes[0x19] = (char)((ulong)dVar3 >> 8);
          outputInfo.checksum.bytes[0x1a] = (char)((ulong)dVar3 >> 0x10);
          outputInfo.checksum.bytes[0x1b] = (char)((ulong)dVar3 >> 0x18);
          outputInfo.checksum.bytes[0x1c] = (char)((ulong)dVar3 >> 0x20);
          outputInfo.checksum.bytes[0x1d] = (char)((ulong)dVar3 >> 0x28);
          outputInfo.checksum.bytes[0x1e] = (char)((ulong)dVar3 >> 0x30);
          outputInfo.checksum.bytes[0x1f] = (char)((ulong)dVar3 >> 0x38);
          BuildValue::makeExistingInput(outputInfo);
        }
      }
      else {
        BuildValue::makeVirtualInput();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BuildValue ExternalCommand::
getResultForOutput(Node* node, const BuildValue& value) {
  // If the value was a failed or cancelled command, propagate the failure.
  if (value.isFailedCommand() || value.isPropagatedFailureCommand() ||
      value.isCancelledCommand())
    return BuildValue::makeFailedInput();
  if (value.isSkippedCommand())
      return BuildValue::makeSkippedCommand();

  // Otherwise, we should have a successful command -- return the actual
  // result for the output.
  assert(value.isSuccessfulCommand());

  // If the node is virtual, the output is always a virtual input value.
  //
  // FIXME: Eliminate this, and make the build value array contain an array of
  // build values.
  auto buildNode = static_cast<BuildNode*>(node);
  if (buildNode->isVirtual() && !buildNode->isCommandTimestamp()) {
    return BuildValue::makeVirtualInput();
  }
    
  // Find the index of the output node.
  //
  // FIXME: This is O(N). We don't expect N to be large in practice, but it
  // could be.
  auto it = std::find(outputs.begin(), outputs.end(), node);
  assert(it != outputs.end());
    
  auto idx = it - outputs.begin();
  assert(idx < static_cast<ssize_t>(value.getNumOutputs()));

  auto& info = value.getNthOutputInfo(idx);
  if (info.isMissing())
    return BuildValue::makeMissingOutput();
    
  return BuildValue::makeExistingInput(info);
}